

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

void mcpl_internal_delete_file(char *filename)

{
  char *in_RDI;
  
  unlink(in_RDI);
  return;
}

Assistant:

void mcpl_internal_delete_file( const char * filename )
{
  assert(filename);
#ifdef _WIN32
  mcu8str f = mcu8str_view_cstr( filename );
  wchar_t* wpath = mctools_path2wpath(&f);//must free(..) return value.
  _wunlink(wpath);
  free(wpath);
#else
  unlink(filename);
#endif
}